

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interpreter.cpp
# Opt level: O3

bool __thiscall
Interpreter::belongToCondition
          (Interpreter *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *condition_string_vector_arg,Command *condition_command_pointer_arg)

{
  pointer *pppCVar1;
  iterator iVar2;
  long lVar3;
  Command *local_20;
  Command *condition_command_pointer_arg_local;
  
  local_20 = condition_command_pointer_arg;
  if (this->is_if_command == true) {
    iVar2._M_current =
         (this->if_commands_pointers).super__Vector_base<Command_*,_std::allocator<Command_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->if_commands_pointers).super__Vector_base<Command_*,_std::allocator<Command_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<Command*,std::allocator<Command*>>::_M_realloc_insert<Command*const&>
                ((vector<Command*,std::allocator<Command*>> *)&this->if_commands_pointers,iVar2,
                 &local_20);
    }
    else {
      *iVar2._M_current = condition_command_pointer_arg;
      pppCVar1 = &(this->if_commands_pointers).
                  super__Vector_base<Command_*,_std::allocator<Command_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppCVar1 = *pppCVar1 + 1;
    }
    lVar3 = 200;
  }
  else {
    if (this->is_while_command != true) {
      return false;
    }
    iVar2._M_current =
         (this->while_commands_pointers).super__Vector_base<Command_*,_std::allocator<Command_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->while_commands_pointers).super__Vector_base<Command_*,_std::allocator<Command_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<Command*,std::allocator<Command*>>::_M_realloc_insert<Command*const&>
                ((vector<Command*,std::allocator<Command*>> *)&this->while_commands_pointers,iVar2,
                 &local_20);
    }
    else {
      *iVar2._M_current = condition_command_pointer_arg;
      pppCVar1 = &(this->while_commands_pointers).
                  super__Vector_base<Command_*,_std::allocator<Command_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppCVar1 = *pppCVar1 + 1;
    }
    lVar3 = 0x98;
  }
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::push_back((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)((long)&(this->lexed_data_to_interpret).
                         super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar3),
              condition_string_vector_arg);
  return true;
}

Assistant:

bool Interpreter::belongToCondition(vector<string> condition_string_vector_arg,
                                    Command *condition_command_pointer_arg) {
  if (this->is_if_command) {
    this->if_commands_pointers.push_back(condition_command_pointer_arg);
    this->if_strings_vectors.push_back(condition_string_vector_arg);
    return true;
  } else if (this->is_while_command) {
    this->while_commands_pointers.push_back(condition_command_pointer_arg);
    this->while_strings_vectors.push_back(condition_string_vector_arg);
    return true;
  } else return false;
}